

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satClause.h
# Opt level: O0

void Sat_MemRestart(Sat_Mem_t *p)

{
  Sat_Mem_t *p_local;
  
  p->nEntries[0] = 0;
  p->nEntries[1] = 0;
  p->iPage[0] = 0;
  p->iPage[1] = 1;
  Sat_MemWriteLimit(*p->pPages,2);
  Sat_MemWriteLimit(p->pPages[1],2);
  return;
}

Assistant:

static inline void Sat_MemRestart( Sat_Mem_t * p )
{
    p->nEntries[0]  = 0;
    p->nEntries[1]  = 0;
    p->iPage[0]     = 0;
    p->iPage[1]     = 1;
    Sat_MemWriteLimit( p->pPages[0], 2 );
    Sat_MemWriteLimit( p->pPages[1], 2 );
}